

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O2

bool __thiscall
PSEngine::does_move_info_matches_rule
          (PSEngine *this,ObjectMoveType p_move_type,EntityRuleInfo p_rule_info,
          AbsoluteDirection p_rule_dir)

{
  iterator iVar1;
  undefined4 in_register_00000034;
  bool bVar2;
  set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
  allowed_move_types;
  optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
  move_types_opt;
  ObjectMoveType local_84;
  _Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
  local_80;
  _Optional_payload_base<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
  local_50;
  
  bVar2 = true;
  if (p_rule_info != None) {
    local_84 = p_move_type;
    if (p_rule_info == No) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp"
                    ,0x1d0,
                    "bool PSEngine::does_move_info_matches_rule(ObjectMoveType, CompiledGame::EntityRuleInfo, AbsoluteDirection)"
                   );
    }
    convert_entity_rule_info_to_allowed_move_types
              ((optional<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
                *)&local_50,(PSEngine *)CONCAT44(in_register_00000034,p_move_type),p_rule_info,
               p_rule_dir);
    if (local_50._M_engaged != true) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp"
                    ,0x1e7,
                    "bool PSEngine::does_move_info_matches_rule(ObjectMoveType, CompiledGame::EntityRuleInfo, AbsoluteDirection)"
                   );
    }
    std::
    _Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
    ::_Rb_tree(&local_80,
               (_Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
                *)&local_50);
    if (local_80._M_impl.super__Rb_tree_header._M_node_count == 0) {
      bVar2 = p_move_type == Stationary;
    }
    else {
      iVar1 = std::
              _Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
              ::find(&local_80,&local_84);
      bVar2 = (_Rb_tree_header *)iVar1._M_node != &local_80._M_impl.super__Rb_tree_header;
    }
    std::
    _Rb_tree<PSEngine::ObjectMoveType,_PSEngine::ObjectMoveType,_std::_Identity<PSEngine::ObjectMoveType>,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>
    ::~_Rb_tree(&local_80);
    std::
    _Optional_payload_base<std::set<PSEngine::ObjectMoveType,_std::less<PSEngine::ObjectMoveType>,_std::allocator<PSEngine::ObjectMoveType>_>_>
    ::_M_reset(&local_50);
  }
  return bVar2;
}

Assistant:

bool PSEngine::does_move_info_matches_rule(ObjectMoveType p_move_type, CompiledGame::EntityRuleInfo p_rule_info, AbsoluteDirection p_rule_dir)
{
    if(p_rule_info == CompiledGame::EntityRuleInfo::None)
    {
        return true;
    }
    else if( p_rule_info == CompiledGame::EntityRuleInfo::No)
    {
        assert(false);
        PS_LOG_ERROR("should not happen");
        return false;
    }
    else
    {
        optional<set<ObjectMoveType>> move_types_opt = convert_entity_rule_info_to_allowed_move_types(p_rule_info,p_rule_dir);

        if(move_types_opt.has_value())
        {
            set<PSEngine::ObjectMoveType>allowed_move_types = move_types_opt.value();

            if(allowed_move_types.size() == 0)
            {
                return p_move_type == PSEngine::ObjectMoveType::Stationary;
            }
            else
            {
                return allowed_move_types.find(p_move_type) != allowed_move_types.end();
            }
        }
        else
        {
            assert(false);
            PS_LOG_ERROR("should not happen");
            return false;
        }
    }
}